

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::FillStaticLayerParams::ByteSizeLong(FillStaticLayerParams *this)

{
  size_t sVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  unsigned_long *puVar5;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar4 = (this->targetshape_).current_size_;
  uVar9 = 0;
  if ((int)uVar4 < 1) {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    do {
      puVar5 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->targetshape_,(int)uVar9);
      lVar3 = 0x3f;
      if ((*puVar5 | 1) != 0) {
        for (; (*puVar5 | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      lVar7 = lVar7 + (ulong)((int)lVar3 * 9 + 0x49U >> 6);
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
    } while (uVar4 != uVar8);
    if (lVar7 == 0) {
      lVar7 = 0;
      uVar9 = 0;
    }
    else if ((int)(uint)lVar7 < 0) {
      uVar9 = 0xb;
    }
    else {
      uVar4 = (uint)lVar7 | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar9 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
  }
  this->_targetshape_cached_byte_size_ = (int)lVar7;
  sVar1 = uVar9 + 5 + lVar7;
  sVar6 = uVar9 + lVar7;
  if (this->value_ != 0.0) {
    sVar6 = sVar1;
  }
  if (NAN(this->value_)) {
    sVar6 = sVar1;
  }
  this->_cached_size_ = (int)sVar6;
  return sVar6;
}

Assistant:

size_t FillStaticLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.FillStaticLayerParams)
  size_t total_size = 0;

  // repeated uint64 targetShape = 2;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->targetshape_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _targetshape_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // float value = 1;
  if (this->value() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}